

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

void Mio_DeriveGateDelays
               (Mio_Gate_t *pGate,float **ptPinDelays,int nPins,int nInputs,float tDelayZero,
               float *ptDelaysRes,float *ptPinDelayMax)

{
  Mio_Pin_t *pMVar1;
  char *pcVar2;
  Mio_Pin_t *pMVar3;
  ulong uVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  
  if (pGate->nInputs != nPins) {
    __assert_fail("pGate->nInputs == nPins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                  ,0x425,
                  "void Mio_DeriveGateDelays(Mio_Gate_t *, float **, int, int, float, float *, float *)"
                 );
  }
  if (0 < nInputs) {
    uVar4 = 0;
    do {
      ptDelaysRes[uVar4] = tDelayZero;
      uVar4 = uVar4 + 1;
    } while ((uint)nInputs != uVar4);
  }
  if (nInputs < 1) {
    fVar6 = 0.0;
  }
  else {
    pMVar1 = pGate->pPins;
    uVar4 = 0;
    fVar6 = 0.0;
    do {
      lVar5 = 0;
      if (pMVar1 != (Mio_Pin_t *)0x0) {
        lVar5 = 0;
        pMVar3 = pMVar1;
        do {
          if ((0.0 <= ptPinDelays[lVar5][uVar4]) &&
             (fVar7 = ptPinDelays[lVar5][uVar4] + (float)pMVar3->dDelayBlockMax,
             ptDelaysRes[uVar4] <= fVar7 && fVar7 != ptDelaysRes[uVar4])) {
            ptDelaysRes[uVar4] = fVar7;
          }
          lVar5 = lVar5 + 1;
          pMVar3 = pMVar3->pNext;
        } while (pMVar3 != (Mio_Pin_t *)0x0);
      }
      if ((int)lVar5 != nPins) {
        pcVar2 = Mio_GateReadName(pGate);
        printf("DEBUG: problem gate is %s\n",pcVar2);
        __assert_fail("k == nPins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                      ,0x439,
                      "void Mio_DeriveGateDelays(Mio_Gate_t *, float **, int, int, float, float *, float *)"
                     );
      }
      fVar7 = ptDelaysRes[uVar4];
      if (ptDelaysRes[uVar4] <= fVar6) {
        fVar7 = fVar6;
      }
      fVar6 = fVar7;
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)nInputs);
  }
  *ptPinDelayMax = fVar6;
  return;
}

Assistant:

void Mio_DeriveGateDelays( Mio_Gate_t * pGate, 
    float ** ptPinDelays, int nPins, int nInputs, float tDelayZero, 
    float * ptDelaysRes, float * ptPinDelayMax )
{
    Mio_Pin_t * pPin;
    float Delay, DelayMax;
    int i, k;
    assert( pGate->nInputs == nPins );
    // set all the delays to the unused delay
    for ( i = 0; i < nInputs; i++ )
        ptDelaysRes[i] = tDelayZero;
    // compute the delays for each input and the max delay at the same time
    DelayMax = 0;
    for ( i = 0; i < nInputs; i++ )
    {
        for ( k = 0, pPin = pGate->pPins; pPin; pPin = pPin->pNext, k++ )
        {
            if ( ptPinDelays[k][i] < 0 )
                continue;
            Delay = ptPinDelays[k][i] + (float)pPin->dDelayBlockMax;
            if ( ptDelaysRes[i] < Delay )
                ptDelaysRes[i] = Delay;
        }
        if ( k != nPins )
        {
            printf ("DEBUG: problem gate is %s\n", Mio_GateReadName( pGate ));
        }
        assert( k == nPins );
        if ( DelayMax < ptDelaysRes[i] )
            DelayMax = ptDelaysRes[i];
    }
    *ptPinDelayMax = DelayMax;
}